

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperatorInterface.cpp
# Opt level: O1

void __thiscall
adios2::plugin::PluginOperatorInterface::PluginOperatorInterface
          (PluginOperatorInterface *this,Params *parameters)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"PluginInterface","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plugin","");
  core::Operator::Operator(&this->super_Operator,&local_40,PLUGIN_INTERFACE,&local_60,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__Operator_008838e0;
  return;
}

Assistant:

PluginOperatorInterface::PluginOperatorInterface(const Params &parameters)
: Operator("PluginInterface", PLUGIN_INTERFACE, "plugin", parameters)
{
}